

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::AssertionStack::Print(AssertionStack *this,DebugWriter *w,Matcher *matcher)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AssertionInfo *pAVar4;
  undefined1 local_40 [8];
  Iterator it;
  
  local_40 = (undefined1  [8])
             (this->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
  if (local_40 != (undefined1  [8])0x0) {
    it.super_Iterator.nextTop = (size_t)this;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pAVar4 = ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::
               operator*((Iterator *)local_40);
      DebugWriter::PrintEOL
                (w,L"beginLabel: L%04x, startInputOffset: %u, contStackPosition: $llu",
                 (ulong)pAVar4->beginLabel,(ulong)pAVar4->startInputOffset,pAVar4->contStackPosition
                );
      if (local_40 == (undefined1  [8])0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                           ,0x150,"(*this)","*this");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      local_40 = (undefined1  [8])((long)local_40 - 0x10);
    } while (local_40 != (undefined1  [8])0x0);
  }
  return;
}

Assistant:

void AssertionStack::Print(DebugWriter* w, const Matcher* matcher) const
    {
        for (Iterator it(*this); it; ++it)
        {
            it->Print(w);
        }
    }